

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_internal.h
# Opt level: O0

void ZSTD_safecopyLiterals(BYTE *op,BYTE *ip,BYTE *iend,BYTE *ilimit_w)

{
  BYTE *ilimit_w_local;
  BYTE *iend_local;
  BYTE *ip_local;
  BYTE *op_local;
  BYTE *oend;
  BYTE *op_1;
  BYTE *ip_1;
  ptrdiff_t diff;
  
  if (iend <= ilimit_w) {
    __assert_fail("iend > ilimit_w",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x273,
                  "void ZSTD_safecopyLiterals(BYTE *, const BYTE *, const BYTE *const, const BYTE *)"
                 );
  }
  iend_local = ip;
  ip_local = op;
  if (ip <= ilimit_w) {
    if (((long)op - (long)ip < 0x10) && (-0x10 < (long)op - (long)ip)) {
      __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                    ,0xe9,
                    "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
    }
    ZSTD_copy16(op,ip);
    if (0x10 < (long)ilimit_w - (long)ip) {
      oend = op + 0x10;
      op_1 = ip + 0x10;
      do {
        ZSTD_copy16(oend,op_1);
        ZSTD_copy16(oend + 0x10,op_1 + 0x10);
        oend = oend + 0x20;
        op_1 = op_1 + 0x20;
      } while (oend < op + ((long)ilimit_w - (long)ip));
    }
    ip_local = op + ((long)ilimit_w - (long)ip);
    iend_local = ilimit_w;
  }
  while (iend_local < iend) {
    *ip_local = *iend_local;
    iend_local = iend_local + 1;
    ip_local = ip_local + 1;
  }
  return;
}

Assistant:

static void
ZSTD_safecopyLiterals(BYTE* op, BYTE const* ip, BYTE const* const iend, BYTE const* ilimit_w)
{
    assert(iend > ilimit_w);
    if (ip <= ilimit_w) {
        ZSTD_wildcopy(op, ip, ilimit_w - ip, ZSTD_no_overlap);
        op += ilimit_w - ip;
        ip = ilimit_w;
    }
    while (ip < iend) *op++ = *ip++;
}